

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::log<char_const(&)[19],char_const(&)[28]>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [19],
               char (*params_1) [28])

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  char (*params_00) [28];
  long lVar3;
  String argValues [2];
  ArrayPtr<kj::String> in_stack_ffffffffffffffa8;
  undefined8 uStack_48;
  String local_40;
  
  str<char_const(&)[19]>
            ((String *)&stack0xffffffffffffffa8,(kj *)params,
             (char (*) [19])CONCAT44(in_register_00000014,severity));
  str<char_const(&)[28]>(&local_40,(kj *)params_1,params_00);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffffa8,in_stack_ffffffffffffffa8);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffffa8 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffffb0 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffffa8 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffffb0 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&uStack_48 + lVar3))
                (*(undefined8 **)((long)&uStack_48 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}